

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O0

void csp_eth_pbuf_cleanup(csp_eth_interface_data_t *ifdata,uint32_t now,int *task_woken)

{
  long in_RDX;
  int in_ESI;
  long in_RDI;
  csp_packet_t *prev;
  csp_packet_t *packet;
  undefined8 local_28;
  void *packet_00;
  
  packet_00 = *(void **)(in_RDI + 0x78);
  local_28 = (void *)0x0;
  while (packet_00 != (void *)0x0) {
    if (1000 < (uint)(in_ESI - *(int *)((long)packet_00 + 8))) {
      if (local_28 == (void *)0x0) {
        *(undefined8 *)(in_RDI + 0x78) = *(undefined8 *)((long)packet_00 + 0x30);
      }
      else {
        *(undefined8 *)((long)local_28 + 0x30) = *(undefined8 *)((long)packet_00 + 0x30);
      }
      if (in_RDX == 0) {
        csp_buffer_free(packet_00);
      }
      else {
        csp_buffer_free_isr(packet_00);
      }
    }
    local_28 = packet_00;
    packet_00 = *(void **)((long)local_28 + 0x30);
  }
  return;
}

Assistant:

void csp_eth_pbuf_cleanup(csp_eth_interface_data_t * ifdata, uint32_t now, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if ((now - packet->last_used) > PBUF_TIMEOUT_MS) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (task_woken == NULL) {
				csp_buffer_free(packet);
			} else {
				csp_buffer_free_isr(packet);
			}

		}

		prev = packet;
		packet = packet->next;
	}

}